

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParallelLight.cpp
# Opt level: O2

Color __thiscall ParallelLight::diffuse(ParallelLight *this,vec3 hitpoint,shared_ptr<Obj> *object)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 extraout_RDX;
  double dVar2;
  tvec4<float,_(glm::precision)0> right;
  vec4 left;
  Color result;
  Color local_1c;
  
  iVar1 = (*((object->super___shared_ptr<Obj,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Obj[2])
                    (hitpoint.field_0._0_8_,
                     CONCAT44((int)((ulong)register0x00001240 >> 0x20),hitpoint.field_0._8_4_));
  left.field_0.field_0.y = (float)extraout_var;
  left.field_0.field_0.x = (float)iVar1;
  right = glm::operator-((glm *)&(this->super_Light).field_0xc,
                         (tvec4<float,_(glm::precision)0> *)object);
  left.field_0._8_8_ = extraout_RDX;
  dVar2 = Obj::dot(left,(vec4)right.field_0);
  dVar2 = dVar2 * 255.0;
  Color::Color(&local_1c,dVar2,dVar2,dVar2);
  return local_1c;
}

Assistant:

Color ParallelLight::diffuse(glm::vec3 hitpoint, std::shared_ptr<Obj> object) {
    glm::vec4 normal = object->getNormal(hitpoint);
    double diffuseFactor = Obj::dot(normal, -direction);
    Color result(diffuseFactor * 255, diffuseFactor * 255, diffuseFactor * 255);
    return result;
}